

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_disjoint(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *b2;
  undefined8 uVar2;
  bitset_t *bitset;
  int i;
  ulong i_00;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (i_00 = 0; i_00 != 1000; i_00 = i_00 + 1) {
    bitset = b2;
    if ((i_00 & 1) == 0) {
      bitset = b1;
    }
    bitset_set(bitset,i_00);
  }
  _Var1 = bitsets_disjoint(b1,b2);
  if (_Var1) {
    bitset_set(b1,0x1f5);
    bitset_set(b2,0x1f5);
    _Var1 = bitsets_disjoint(b1,b2);
    if (!_Var1) {
      bitset_free(b1);
      bitset_free(b2);
      return;
    }
    uVar2 = 0xb2;
  }
  else {
    uVar2 = 0xad;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_disjoint",uVar2);
  exit(1);
}

Assistant:

void test_disjoint() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(bitsets_disjoint(evens, odds));

  bitset_set(evens, 501);
  bitset_set(odds, 501);

  TEST_ASSERT(!bitsets_disjoint(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}